

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_import_raw
              (mbedtls_rsa_context *ctx,uchar *N,size_t N_len,uchar *P,size_t P_len,uchar *Q,
              size_t Q_len,uchar *D,size_t D_len,uchar *E,size_t E_len)

{
  size_t sVar1;
  int local_44;
  int ret;
  uchar *Q_local;
  size_t P_len_local;
  uchar *P_local;
  size_t N_len_local;
  uchar *N_local;
  mbedtls_rsa_context *ctx_local;
  
  local_44 = 0;
  if (N != (uchar *)0x0) {
    local_44 = mbedtls_mpi_read_binary(&ctx->N,N,N_len);
    if (local_44 != 0) goto LAB_00116527;
    sVar1 = mbedtls_mpi_size(&ctx->N);
    ctx->len = sVar1;
  }
  if ((((P == (uchar *)0x0) || (local_44 = mbedtls_mpi_read_binary(&ctx->P,P,P_len), local_44 == 0))
      && ((Q == (uchar *)0x0 || (local_44 = mbedtls_mpi_read_binary(&ctx->Q,Q,Q_len), local_44 == 0)
          ))) &&
     (((D == (uchar *)0x0 || (local_44 = mbedtls_mpi_read_binary(&ctx->D,D,D_len), local_44 == 0))
      && (E != (uchar *)0x0)))) {
    local_44 = mbedtls_mpi_read_binary(&ctx->E,E,E_len);
  }
LAB_00116527:
  if (local_44 == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = local_44 + -0x4080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_import_raw( mbedtls_rsa_context *ctx,
                            unsigned char const *N, size_t N_len,
                            unsigned char const *P, size_t P_len,
                            unsigned char const *Q, size_t Q_len,
                            unsigned char const *D, size_t D_len,
                            unsigned char const *E, size_t E_len )
{
    int ret = 0;
    RSA_VALIDATE_RET( ctx != NULL );

    if( N != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &ctx->N, N, N_len ) );
        ctx->len = mbedtls_mpi_size( &ctx->N );
    }

    if( P != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &ctx->P, P, P_len ) );

    if( Q != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &ctx->Q, Q, Q_len ) );

    if( D != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &ctx->D, D, D_len ) );

    if( E != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &ctx->E, E, E_len ) );

cleanup:

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA + ret );

    return( 0 );
}